

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_deserialize(void *buf)

{
  uint uVar1;
  roaring_bitmap_t *prVar2;
  uint32_t i;
  ulong uVar3;
  roaring_bulk_context_t context;
  roaring_bulk_context_t local_38;
  
  if (*buf == '\x02') {
    prVar2 = roaring_bitmap_portable_deserialize((char *)((long)buf + 1));
    return prVar2;
  }
  if (*buf == '\x01') {
    uVar1 = *(uint *)((long)buf + 1);
    prVar2 = roaring_bitmap_create();
    if (prVar2 != (roaring_bitmap_t *)0x0) {
      local_38.container = (void *)0x0;
      local_38.idx = 0;
      local_38.key = 0;
      local_38.typecode = '\0';
      local_38._15_1_ = 0;
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        add_bulk_impl(prVar2,&local_38,*(uint32_t *)((long)buf + uVar3 * 4 + 5));
      }
      return prVar2;
    }
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize(const void *buf) {
    const char *bufaschar = (const char *)buf;
    if (bufaschar[0] == CROARING_SERIALIZATION_ARRAY_UINT32) {
        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;

        memcpy(&card, bufaschar + 1, sizeof(uint32_t));

        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        roaring_bitmap_t *bitmap = roaring_bitmap_create();
        if (bitmap == NULL) {
            return NULL;
        }
        roaring_bulk_context_t context = CROARING_ZERO_INITIALIZER;
        for (uint32_t i = 0; i < card; i++) {
            // elems may not be aligned, read with memcpy
            uint32_t elem;
            memcpy(&elem, elems + i, sizeof(elem));
            roaring_bitmap_add_bulk(bitmap, &context, elem);
        }
        return bitmap;

    } else if (bufaschar[0] == CROARING_SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize(bufaschar + 1);
    } else
        return (NULL);
}